

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O3

void __thiscall
Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>::appendVariables
          (VariableValueExpression<bool> *this,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = "false";
  if ((ulong)this->value != 0) {
    pcVar1 = "true";
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,pcVar1,pcVar1 + ((ulong)this->value ^ 5));
  std::
  vector<Enhedron::Assertion::Impl::Configurable::Variable,std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>>
  ::emplace_back<char_const*const&,std::__cxx11::string,char_const*const&,int_const&>
            ((vector<Enhedron::Assertion::Impl::Configurable::Variable,std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>>
              *)variableList,&this->variableName,&local_40,&this->file,&this->line);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void appendVariables(vector<Variable> &variableList) const {
            variableList.emplace_back(variableName, Convert<Value>::toString(value), file, line);
        }